

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall ccs::CcsContext::CcsContext(CcsContext *this,CcsContext *parent,string *name)

{
  string *name_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  Key local_68;
  shared_ptr<const_ccs::SearchState> local_30;
  string *local_20;
  string *name_local;
  CcsContext *parent_local;
  CcsContext *this_local;
  
  local_20 = name;
  name_local = (string *)parent;
  parent_local = this;
  std::shared_ptr<ccs::SearchState_const>::shared_ptr<ccs::SearchState,void>
            ((shared_ptr<ccs::SearchState_const> *)&local_30,&parent->searchState);
  name_00 = local_20;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88);
  Key::Key(&local_68,name_00,&local_88);
  SearchState::newChild((SearchState *)this,&local_30,&local_68);
  Key::~Key(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::shared_ptr<const_ccs::SearchState>::~shared_ptr(&local_30);
  return;
}

Assistant:

CcsContext::CcsContext(const CcsContext &parent, const std::string &name)
  : searchState(SearchState::newChild(parent.searchState, Key(name, {}))) {}